

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

float Abc_SclCountNonBufferLoad(SC_Man *p,Abc_Obj_t *pObj)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  if ((pObj->vFanouts).nSize < 1) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = 0.0;
    lVar1 = 0;
    do {
      fVar2 = Abc_SclCountNonBufferLoadInt
                        (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar1]]);
      fVar3 = fVar3 + fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 < (pObj->vFanouts).nSize);
  }
  return p->pLoads[(uint)pObj->Id].rise * 0.5 + p->pLoads[(uint)pObj->Id].fall * 0.5 + fVar3;
}

Assistant:

float Abc_SclCountNonBufferLoad( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Load = 0;
    int i; 
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Load += Abc_SclCountNonBufferLoadInt( p, pFanout );
    Load += 0.5 * Abc_SclObjLoad(p, pObj)->rise + 0.5 * Abc_SclObjLoad(p, pObj)->fall;
    return Load;
}